

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

Amap_Lib_t * Amap_LibAlloc(void)

{
  Amap_Lib_t *__s;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Aig_MmFlex_t *pAVar3;
  
  __s = (Amap_Lib_t *)malloc(0xa0);
  memset(__s,0,0xa0);
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  __s->vGates = pVVar1;
  pAVar3 = Aig_MmFlexStart();
  __s->pMemGates = pAVar3;
  pAVar3 = Aig_MmFlexStart();
  __s->pMemSet = pAVar3;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocs a library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Lib_t * Amap_LibAlloc()
{
    Amap_Lib_t * p;
    p = (Amap_Lib_t *)ABC_ALLOC( Amap_Lib_t, 1 );
    memset( p, 0, sizeof(Amap_Lib_t) );
    p->vGates = Vec_PtrAlloc( 100 );
    p->pMemGates = Aig_MmFlexStart();
    p->pMemSet = Aig_MmFlexStart();
    return p;
}